

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_add_zinv_var
               (secp256k1_gej *r,secp256k1_gej *a,secp256k1_ge *b,secp256k1_fe *bzinv)

{
  uint64_t *puVar1;
  bool bVar2;
  bool bVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  int extraout_EDX;
  uint uVar12;
  uint extraout_EDX_00;
  secp256k1_ge *a_00;
  ulong uVar13;
  secp256k1_gej *psVar14;
  ulong uVar15;
  secp256k1_gej *psVar16;
  secp256k1_gej *r_00;
  ulong uVar17;
  secp256k1_gej *r_01;
  ulong uVar18;
  secp256k1_gej *a_01;
  secp256k1_ge *a_02;
  secp256k1_gej *a_03;
  ulong uVar19;
  secp256k1_gej *r_02;
  secp256k1_gej *a_04;
  ulong uVar20;
  secp256k1_fe s1;
  secp256k1_fe h3;
  secp256k1_fe u2;
  secp256k1_fe i;
  secp256k1_fe h;
  secp256k1_fe az;
  secp256k1_fe u1;
  secp256k1_fe s2;
  secp256k1_fe z12;
  secp256k1_fe sStack_360;
  secp256k1_fe sStack_330;
  ulong uStack_300;
  secp256k1_gej *psStack_2f8;
  ulong uStack_2f0;
  ulong uStack_2e8;
  secp256k1_gej *psStack_2e0;
  secp256k1_gej *psStack_2d0;
  secp256k1_gej *psStack_2c8;
  secp256k1_gej *psStack_2c0;
  code *pcStack_2b8;
  int iStack_2ac;
  secp256k1_gej *psStack_2a8;
  code *pcStack_2a0;
  ulong local_298;
  ulong local_290;
  secp256k1_gej *local_288;
  secp256k1_gej *local_280;
  secp256k1_gej *local_278;
  ulong local_270;
  secp256k1_gej *local_268;
  ulong local_260;
  secp256k1_fe *local_258;
  secp256k1_gej *local_250;
  undefined1 local_248 [56];
  uint64_t uStack_210;
  uint64_t local_208;
  uint64_t uStack_200;
  uint64_t local_1f8;
  int local_1f0;
  undefined1 local_1e8 [56];
  uint64_t uStack_1b0;
  uint64_t local_1a8;
  uint64_t uStack_1a0;
  uint64_t local_198;
  int local_190;
  int local_18c;
  undefined1 local_188 [56];
  ulong local_150;
  ulong local_148;
  secp256k1_gej *local_140;
  ulong local_138;
  ulong local_130;
  secp256k1_fe local_128;
  secp256k1_fe local_f8;
  secp256k1_fe local_c8;
  secp256k1_fe local_98;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  int local_40;
  int iStack_3c;
  
  pcStack_2a0 = (code *)0x1467c9;
  secp256k1_gej_verify(a);
  pcStack_2a0 = (code *)0x1467d1;
  secp256k1_ge_verify(b);
  pcStack_2a0 = (code *)0x1467d9;
  secp256k1_fe_verify(bzinv);
  if (a->infinity != 0) {
    r->infinity = b->infinity;
    pcStack_2a0 = (code *)0x146805;
    secp256k1_fe_sqr(&local_128,bzinv);
    pcStack_2a0 = (code *)0x14681b;
    secp256k1_fe_mul(&local_98,&local_128,bzinv);
    pcStack_2a0 = (code *)0x146829;
    secp256k1_fe_mul(&r->x,&b->x,&local_128);
    pcStack_2a0 = (code *)0x14683c;
    secp256k1_fe_mul(&r->y,&b->y,&local_98);
    r_02 = (secp256k1_gej *)&r->z;
    (r->z).n[0] = 1;
    (r->z).n[1] = 0;
    (r->z).n[2] = 0;
    (r->z).n[3] = 0;
    (r->z).n[4] = 0;
    (r->z).magnitude = 1;
    (r->z).normalized = 1;
LAB_00146867:
    pcStack_2a0 = (code *)0x14686c;
    secp256k1_fe_verify(&r_02->x);
    pcStack_2a0 = (code *)0x146874;
    secp256k1_gej_verify(r);
    return;
  }
  if (b->infinity != 0) {
    memcpy(r,a,0x98);
    return;
  }
  local_258 = &a->z;
  pcStack_2a0 = (code *)0x1468cb;
  secp256k1_fe_mul(&local_128,local_258,bzinv);
  pcStack_2a0 = (code *)0x1468de;
  secp256k1_fe_sqr(&local_98,&local_128);
  local_f8.n[0] = (a->x).n[0];
  local_f8.n[1] = (a->x).n[1];
  local_f8.n[2] = (a->x).n[2];
  local_f8.n[3] = (a->x).n[3];
  local_f8.n[4] = (a->x).n[4];
  local_f8.magnitude = (a->x).magnitude;
  local_f8.normalized = (a->x).normalized;
  pcStack_2a0 = (code *)0x146913;
  secp256k1_fe_mul((secp256k1_fe *)local_1e8,&b->x,&local_98);
  local_248._0_8_ = (a->y).n[0];
  local_248._8_8_ = (a->y).n[1];
  local_248._16_8_ = (a->y).n[2];
  local_248._24_8_ = (a->y).n[3];
  local_248._32_8_ = (a->y).n[4];
  local_248._40_4_ = (a->y).magnitude;
  local_248._44_4_ = (a->y).normalized;
  pcStack_2a0 = (code *)0x146954;
  local_288 = a;
  secp256k1_fe_mul(&local_c8,&b->y,&local_98);
  pcStack_2a0 = (code *)0x146967;
  secp256k1_fe_mul(&local_c8,&local_c8,&local_128);
  pcStack_2a0 = (code *)0x14696f;
  secp256k1_fe_verify(&local_f8);
  psVar14 = (secp256k1_gej *)0x4;
  pcStack_2a0 = (code *)0x14697c;
  secp256k1_fe_verify_magnitude(&local_f8,4);
  r_02 = (secp256k1_gej *)(0x9ffff5ffffd9d6 - local_f8.n[0]);
  uVar19 = 0x9ffffffffffff6 - local_f8.n[1];
  uVar13 = 0x9ffffffffffff6 - local_f8.n[2];
  a_03 = (secp256k1_gej *)(0x9ffffffffffff6 - local_f8.n[3]);
  local_290 = 0x9fffffffffff6 - local_f8.n[4];
  local_130 = 5;
  pcStack_2a0 = (code *)0x1469ea;
  local_188._48_8_ = r_02;
  local_150 = uVar19;
  local_148 = uVar13;
  local_140 = a_03;
  local_138 = local_290;
  secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
  pcStack_2a0 = (code *)0x1469f2;
  secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
  a_04 = (secp256k1_gej *)local_1e8;
  pcStack_2a0 = (code *)0x146a02;
  r_00 = a_04;
  secp256k1_fe_verify((secp256k1_fe *)a_04);
  if ((int)local_1e8._40_4_ < 0x1c) {
    local_250 = (secp256k1_gej *)((long)(r_02->x).n + local_1e8._0_8_);
    local_260 = uVar19 + local_1e8._8_8_;
    local_270 = uVar13 + local_1e8._16_8_;
    local_268 = (secp256k1_gej *)((long)(a_03->x).n + local_1e8._24_8_);
    local_290 = local_290 + local_1e8._32_8_;
    local_130 = (ulong)(local_1e8._40_4_ + 5);
    pcStack_2a0 = (code *)0x146a82;
    local_188._48_8_ = local_250;
    local_150 = local_260;
    local_148 = local_270;
    local_140 = local_268;
    local_138 = local_290;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    pcStack_2a0 = (code *)0x146a92;
    secp256k1_fe_verify(&local_c8);
    psVar14 = (secp256k1_gej *)0x1;
    pcStack_2a0 = (code *)0x146a9f;
    secp256k1_fe_verify_magnitude(&local_c8,1);
    a_04 = (secp256k1_gej *)(0x3ffffbfffff0bc - local_c8.n[0]);
    r_02 = (secp256k1_gej *)(0x3ffffffffffffc - local_c8.n[1]);
    local_298 = 0x3ffffffffffffc - local_c8.n[2];
    uVar13 = 0x3ffffffffffffc - local_c8.n[3];
    uVar19 = 0x3fffffffffffc - local_c8.n[4];
    local_188._40_8_ = 2;
    pcStack_2a0 = (code *)0x146b0f;
    local_188._0_8_ = a_04;
    local_188._8_8_ = r_02;
    local_188._16_8_ = local_298;
    local_188._24_8_ = uVar13;
    local_188._32_8_ = uVar19;
    secp256k1_fe_verify((secp256k1_fe *)local_188);
    pcStack_2a0 = (code *)0x146b17;
    secp256k1_fe_verify((secp256k1_fe *)local_188);
    a_03 = (secp256k1_gej *)local_248;
    pcStack_2a0 = (code *)0x146b24;
    r_00 = a_03;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    if (0x1e < (int)local_248._40_4_) goto LAB_0014704b;
    local_280 = (secp256k1_gej *)((long)(a_04->x).n + local_248._0_8_);
    local_278 = (secp256k1_gej *)((long)(r_02->x).n + local_248._8_8_);
    uVar20 = local_298 + local_248._16_8_;
    local_298 = uVar13 + local_248._24_8_;
    uVar13 = uVar19 + local_248._32_8_;
    uVar19 = 0x1000003d0;
    local_188._44_4_ = 0;
    local_188._40_4_ = local_248._40_4_ + 2;
    pcStack_2a0 = (code *)0x146ba7;
    local_188._0_8_ = local_280;
    local_188._8_8_ = local_278;
    local_188._16_8_ = uVar20;
    local_188._24_8_ = local_298;
    local_188._32_8_ = uVar13;
    secp256k1_fe_verify((secp256k1_fe *)local_188);
    pcStack_2a0 = (code *)0x146bb4;
    secp256k1_fe_verify((secp256k1_fe *)(local_188 + 0x30));
    uVar8 = (local_290 >> 0x30) * 0x1000003d1 + (long)local_250;
    if (((uVar8 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar8 & 0xfffffffffffff) == 0)) {
      uVar17 = local_260 + (uVar8 >> 0x34);
      uVar11 = (uVar17 >> 0x34) + local_270;
      uVar18 = (long)(local_268->x).n + (uVar11 >> 0x34);
      uVar15 = (uVar18 >> 0x34) + (local_290 & 0xffffffffffff);
      if ((((uVar17 | uVar8 | uVar11 | uVar18) & 0xfffffffffffff) == 0 && uVar15 == 0) ||
         (((uVar8 | 0x1000003d0) & uVar17 & uVar11 & uVar18 & (uVar15 ^ 0xf000000000000)) ==
          0xfffffffffffff)) {
        pcStack_2a0 = (code *)0x146f77;
        secp256k1_fe_verify((secp256k1_fe *)local_188);
        uVar19 = (uVar13 >> 0x30) * 0x1000003d1 + (long)local_280;
        if (((uVar19 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar19 & 0xfffffffffffff) == 0)) {
          uVar11 = (long)(local_278->x).n + (uVar19 >> 0x34);
          uVar20 = (uVar11 >> 0x34) + uVar20;
          uVar8 = (uVar20 >> 0x34) + local_298;
          uVar13 = (uVar8 >> 0x34) + (uVar13 & 0xffffffffffff);
          if ((((uVar11 | uVar19 | uVar20 | uVar8) & 0xfffffffffffff) == 0 && uVar13 == 0) ||
             (((uVar19 | 0x1000003d0) & uVar11 & uVar20 & uVar8 & (uVar13 ^ 0xf000000000000)) ==
              0xfffffffffffff)) {
            pcStack_2a0 = (code *)0x147041;
            secp256k1_gej_double_var(r,local_288,(secp256k1_fe *)0x0);
            return;
          }
        }
        pcStack_2a0 = (code *)0x14702d;
        secp256k1_gej_set_infinity(r);
        return;
      }
    }
    r->infinity = 0;
    a_04 = (secp256k1_gej *)(local_188 + 0x30);
    pcStack_2a0 = (code *)0x146c9d;
    secp256k1_fe_mul(&r->z,local_258,(secp256k1_fe *)a_04);
    r_02 = (secp256k1_gej *)&stack0xffffffffffffff98;
    pcStack_2a0 = (code *)0x146cb0;
    secp256k1_fe_sqr((secp256k1_fe *)r_02,(secp256k1_fe *)a_04);
    pcStack_2a0 = (code *)0x146cb8;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    pcStack_2a0 = (code *)0x146cc5;
    secp256k1_fe_verify_magnitude((secp256k1_fe *)r_02,1);
    local_68 = 0x3ffffbfffff0bc - local_68;
    uStack_60 = 0x3ffffffffffffc - uStack_60;
    local_58 = 0x3ffffffffffffc - local_58;
    uStack_50 = 0x3ffffffffffffc - uStack_50;
    local_48 = 0x3fffffffffffc - local_48;
    local_40 = 2;
    iStack_3c = 0;
    pcStack_2a0 = (code *)0x146d0d;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    a_03 = (secp256k1_gej *)(local_248 + 0x30);
    pcStack_2a0 = (code *)0x146d23;
    secp256k1_fe_mul((secp256k1_fe *)a_03,(secp256k1_fe *)r_02,(secp256k1_fe *)a_04);
    pcStack_2a0 = (code *)0x146d3b;
    secp256k1_fe_mul((secp256k1_fe *)(local_1e8 + 0x30),&local_f8,(secp256k1_fe *)r_02);
    psVar14 = (secp256k1_gej *)local_188;
    pcStack_2a0 = (code *)0x146d4b;
    secp256k1_fe_sqr(&r->x,(secp256k1_fe *)psVar14);
    pcStack_2a0 = (code *)0x146d53;
    secp256k1_fe_verify(&r->x);
    pcStack_2a0 = (code *)0x146d5b;
    r_00 = a_03;
    secp256k1_fe_verify((secp256k1_fe *)a_03);
    iVar7 = local_1f0 + (r->x).magnitude;
    if (0x20 < iVar7) goto LAB_00147050;
    uVar4 = (r->x).n[1];
    uVar5 = (r->x).n[2];
    uVar6 = (r->x).n[3];
    (r->x).n[0] = (r->x).n[0] + local_248._48_8_;
    (r->x).n[1] = uVar4 + uStack_210;
    (r->x).n[2] = uVar5 + local_208;
    (r->x).n[3] = uVar6 + uStack_200;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_1f8;
    (r->x).magnitude = iVar7;
    (r->x).normalized = 0;
    pcStack_2a0 = (code *)0x146dae;
    secp256k1_fe_verify(&r->x);
    pcStack_2a0 = (code *)0x146db6;
    secp256k1_fe_verify(&r->x);
    r_02 = (secp256k1_gej *)(local_1e8 + 0x30);
    pcStack_2a0 = (code *)0x146dc6;
    r_00 = r_02;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    iVar7 = local_190 + (r->x).magnitude;
    if (0x20 < iVar7) goto LAB_00147055;
    uVar4 = (r->x).n[1];
    uVar5 = (r->x).n[2];
    uVar6 = (r->x).n[3];
    r_02 = (secp256k1_gej *)(local_1e8 + 0x30);
    (r->x).n[0] = (r->x).n[0] + local_1e8._48_8_;
    (r->x).n[1] = uVar4 + uStack_1b0;
    (r->x).n[2] = uVar5 + local_1a8;
    (r->x).n[3] = uVar6 + uStack_1a0;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_198;
    (r->x).magnitude = iVar7;
    (r->x).normalized = 0;
    pcStack_2a0 = (code *)0x146e15;
    secp256k1_fe_verify(&r->x);
    pcStack_2a0 = (code *)0x146e1d;
    secp256k1_fe_verify(&r->x);
    pcStack_2a0 = (code *)0x146e25;
    r_00 = r_02;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    iVar7 = local_190 + (r->x).magnitude;
    if (0x20 < iVar7) goto LAB_0014705a;
    uVar4 = (r->x).n[1];
    uVar5 = (r->x).n[2];
    uVar6 = (r->x).n[3];
    r_02 = (secp256k1_gej *)(local_1e8 + 0x30);
    (r->x).n[0] = (r->x).n[0] + local_1e8._48_8_;
    (r->x).n[1] = uVar4 + uStack_1b0;
    (r->x).n[2] = uVar5 + local_1a8;
    (r->x).n[3] = uVar6 + uStack_1a0;
    puVar1 = (r->x).n + 4;
    *puVar1 = *puVar1 + local_198;
    (r->x).magnitude = iVar7;
    (r->x).normalized = 0;
    pcStack_2a0 = (code *)0x146e74;
    secp256k1_fe_verify(&r->x);
    pcStack_2a0 = (code *)0x146e7c;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    pcStack_2a0 = (code *)0x146e84;
    r_00 = r;
    secp256k1_fe_verify(&r->x);
    iVar7 = (r->x).magnitude + local_190;
    if (0x20 < iVar7) goto LAB_0014705f;
    local_1e8._48_8_ = (r->x).n[0] + local_1e8._48_8_;
    uStack_1b0 = (r->x).n[1] + uStack_1b0;
    local_1a8 = (r->x).n[2] + local_1a8;
    uStack_1a0 = (r->x).n[3] + uStack_1a0;
    local_198 = local_198 + (r->x).n[4];
    local_18c = 0;
    pcStack_2a0 = (code *)0x146ed7;
    local_190 = iVar7;
    secp256k1_fe_verify((secp256k1_fe *)(local_1e8 + 0x30));
    r_02 = (secp256k1_gej *)&r->y;
    pcStack_2a0 = (code *)0x146eee;
    secp256k1_fe_mul((secp256k1_fe *)r_02,(secp256k1_fe *)(local_1e8 + 0x30),
                     (secp256k1_fe *)local_188);
    a_04 = (secp256k1_gej *)(local_248 + 0x30);
    pcStack_2a0 = (code *)0x146f06;
    psVar14 = a_04;
    secp256k1_fe_mul((secp256k1_fe *)a_04,(secp256k1_fe *)a_04,(secp256k1_fe *)local_248);
    pcStack_2a0 = (code *)0x146f0e;
    secp256k1_fe_verify((secp256k1_fe *)r_02);
    pcStack_2a0 = (code *)0x146f16;
    r_00 = a_04;
    secp256k1_fe_verify((secp256k1_fe *)a_04);
    local_1f0 = local_1f0 + (r->y).magnitude;
    if (local_1f0 < 0x21) {
      uVar4 = (r->y).n[1];
      uVar5 = (r->y).n[2];
      uVar6 = (r->y).n[3];
      (r->y).n[0] = (r->y).n[0] + local_248._48_8_;
      (r->y).n[1] = uVar4 + uStack_210;
      (r->y).n[2] = uVar5 + local_208;
      (r->y).n[3] = uVar6 + uStack_200;
      puVar1 = (r->y).n + 4;
      *puVar1 = *puVar1 + local_1f8;
      (r->y).magnitude = local_1f0;
      (r->y).normalized = 0;
      goto LAB_00146867;
    }
  }
  else {
    pcStack_2a0 = (code *)0x14704b;
    secp256k1_gej_add_zinv_var_cold_7();
LAB_0014704b:
    pcStack_2a0 = (code *)0x147050;
    secp256k1_gej_add_zinv_var_cold_6();
LAB_00147050:
    pcStack_2a0 = (code *)0x147055;
    secp256k1_gej_add_zinv_var_cold_5();
LAB_00147055:
    pcStack_2a0 = (code *)0x14705a;
    secp256k1_gej_add_zinv_var_cold_4();
LAB_0014705a:
    pcStack_2a0 = (code *)0x14705f;
    secp256k1_gej_add_zinv_var_cold_3();
LAB_0014705f:
    pcStack_2a0 = (code *)0x147064;
    secp256k1_gej_add_zinv_var_cold_2();
  }
  pcStack_2a0 = secp256k1_scalar_cadd_bit;
  secp256k1_gej_add_zinv_var_cold_1();
  uVar8 = (ulong)psVar14 & 0xffffffff;
  pcStack_2b8 = (code *)0x14707a;
  psVar16 = psVar14;
  r_01 = r_00;
  psStack_2a8 = r;
  pcStack_2a0 = (code *)uVar13;
  iStack_2ac = extraout_EDX;
  secp256k1_scalar_verify((secp256k1_scalar *)r_00);
  if ((uint)psVar14 < 0x100) {
    uVar10 = iStack_2ac - 1U & 0x100 | (uint)psVar14;
    uVar12 = uVar10 >> 6;
    bVar9 = (byte)uVar8;
    uVar20 = (ulong)(uVar10 < 0x40) << (bVar9 & 0x3f);
    psVar16 = (secp256k1_gej *)((ulong)(uVar12 == 1) << (bVar9 & 0x3f));
    uVar18 = (ulong)(uVar12 == 2) << (bVar9 & 0x3f);
    uVar15 = (ulong)(uVar12 == 3) << (bVar9 & 0x3f);
    uVar13 = (r_00->x).n[0];
    (r_00->x).n[0] = (r_00->x).n[0] + uVar20;
    puVar1 = (r_00->x).n + 1;
    uVar20 = (ulong)CARRY8(uVar13,uVar20);
    uVar13 = *puVar1;
    uVar11 = (long)(psVar16->x).n + *puVar1;
    *puVar1 = uVar11 + uVar20;
    puVar1 = (r_00->x).n + 2;
    uVar20 = (ulong)(CARRY8(uVar13,(ulong)psVar16) || CARRY8(uVar11,uVar20));
    uVar13 = *puVar1;
    uVar11 = *puVar1 + uVar18;
    *puVar1 = uVar11 + uVar20;
    puVar1 = (r_00->x).n + 3;
    uVar20 = (ulong)(CARRY8(uVar13,uVar18) || CARRY8(uVar11,uVar20));
    uVar13 = *puVar1;
    uVar11 = *puVar1 + uVar15;
    *puVar1 = uVar11 + uVar20;
    bVar2 = !CARRY8(uVar13,uVar15);
    bVar3 = !CARRY8(uVar11,uVar20);
    uVar8 = CONCAT71((int7)(uVar8 >> 8),bVar2 && bVar3);
    pcStack_2b8 = (code *)0x1470e2;
    r_01 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (bVar2 && bVar3) {
      return;
    }
  }
  else {
    pcStack_2b8 = (code *)0x1470f3;
    secp256k1_scalar_cadd_bit_cold_2();
  }
  pcStack_2b8 = secp256k1_scalar_get_bits_var;
  secp256k1_scalar_cadd_bit_cold_1();
  psStack_2e0 = (secp256k1_gej *)0x14710c;
  psVar14 = psVar16;
  a_01 = r_01;
  psStack_2d0 = r_00;
  psStack_2c8 = r_02;
  psStack_2c0 = a_04;
  pcStack_2b8 = (code *)uVar8;
  secp256k1_scalar_verify((secp256k1_scalar *)r_01);
  if (extraout_EDX_00 - 0x21 < 0xffffffe0) {
    psStack_2e0 = (secp256k1_gej *)0x147178;
    secp256k1_scalar_get_bits_var_cold_3();
  }
  else {
    uVar10 = extraout_EDX_00 + (uint)psVar16;
    if (uVar10 < 0x101) {
      if (uVar10 - 1 >> 6 == (uint)(((ulong)psVar16 & 0xffffffff) >> 6)) {
        psStack_2e0 = (secp256k1_gej *)0x147137;
        secp256k1_scalar_verify((secp256k1_scalar *)r_01);
        return;
      }
      if ((uint)psVar16 < 0xc0) {
        return;
      }
      goto LAB_0014717d;
    }
  }
  psStack_2e0 = (secp256k1_gej *)0x14717d;
  secp256k1_scalar_get_bits_var_cold_2();
LAB_0014717d:
  psStack_2e0 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
  secp256k1_scalar_get_bits_var_cold_1();
  uStack_300 = (ulong)extraout_EDX_00;
  psStack_2f8 = a_03;
  uStack_2f0 = uVar19;
  uStack_2e8 = (ulong)psVar16 & 0xffffffff;
  psStack_2e0 = r_01;
  secp256k1_gej_verify(psVar14);
  a_02 = a_00;
  secp256k1_fe_verify(&a_00->x);
  if (psVar14->infinity == 0) {
    secp256k1_fe_sqr(&sStack_330,&a_00->x);
    secp256k1_fe_mul(&sStack_360,&sStack_330,&a_00->x);
    secp256k1_fe_mul(&a_01->x,&psVar14->x,&sStack_330);
    secp256k1_fe_mul(&a_01->y,&psVar14->y,&sStack_360);
    *(int *)(a_01->z).n = psVar14->infinity;
    secp256k1_ge_verify((secp256k1_ge *)a_01);
    return;
  }
  secp256k1_ge_set_gej_zinv_cold_1();
  a_02->infinity = 1;
  (a_02->x).magnitude = 0;
  (a_02->x).normalized = 1;
  (a_02->x).n[0] = 0;
  (a_02->x).n[1] = 0;
  (a_02->x).n[2] = 0;
  (a_02->x).n[3] = 0;
  (a_02->x).n[4] = 0;
  secp256k1_fe_verify(&a_02->x);
  (a_02->y).magnitude = 0;
  (a_02->y).normalized = 1;
  (a_02->y).n[0] = 0;
  (a_02->y).n[1] = 0;
  (a_02->y).n[2] = 0;
  (a_02->y).n[3] = 0;
  (a_02->y).n[4] = 0;
  secp256k1_fe_verify(&a_02->y);
  secp256k1_ge_verify(a_02);
  return;
}

Assistant:

static void secp256k1_gej_add_zinv_var(secp256k1_gej *r, const secp256k1_gej *a, const secp256k1_ge *b, const secp256k1_fe *bzinv) {
    /* Operations: 9 mul, 3 sqr, 11 add/negate/normalizes_to_zero (ignoring special cases) */
    secp256k1_fe az, z12, u1, u2, s1, s2, h, i, h2, h3, t;
    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(b);
    SECP256K1_FE_VERIFY(bzinv);

    if (a->infinity) {
        secp256k1_fe bzinv2, bzinv3;
        r->infinity = b->infinity;
        secp256k1_fe_sqr(&bzinv2, bzinv);
        secp256k1_fe_mul(&bzinv3, &bzinv2, bzinv);
        secp256k1_fe_mul(&r->x, &b->x, &bzinv2);
        secp256k1_fe_mul(&r->y, &b->y, &bzinv3);
        secp256k1_fe_set_int(&r->z, 1);
        SECP256K1_GEJ_VERIFY(r);
        return;
    }
    if (b->infinity) {
        *r = *a;
        return;
    }

    /** We need to calculate (rx,ry,rz) = (ax,ay,az) + (bx,by,1/bzinv). Due to
     *  secp256k1's isomorphism we can multiply the Z coordinates on both sides
     *  by bzinv, and get: (rx,ry,rz*bzinv) = (ax,ay,az*bzinv) + (bx,by,1).
     *  This means that (rx,ry,rz) can be calculated as
     *  (ax,ay,az*bzinv) + (bx,by,1), when not applying the bzinv factor to rz.
     *  The variable az below holds the modified Z coordinate for a, which is used
     *  for the computation of rx and ry, but not for rz.
     */
    secp256k1_fe_mul(&az, &a->z, bzinv);

    secp256k1_fe_sqr(&z12, &az);
    u1 = a->x;
    secp256k1_fe_mul(&u2, &b->x, &z12);
    s1 = a->y;
    secp256k1_fe_mul(&s2, &b->y, &z12); secp256k1_fe_mul(&s2, &s2, &az);
    secp256k1_fe_negate(&h, &u1, SECP256K1_GEJ_X_MAGNITUDE_MAX); secp256k1_fe_add(&h, &u2);
    secp256k1_fe_negate(&i, &s2, 1); secp256k1_fe_add(&i, &s1);
    if (secp256k1_fe_normalizes_to_zero_var(&h)) {
        if (secp256k1_fe_normalizes_to_zero_var(&i)) {
            secp256k1_gej_double_var(r, a, NULL);
        } else {
            secp256k1_gej_set_infinity(r);
        }
        return;
    }

    r->infinity = 0;
    secp256k1_fe_mul(&r->z, &a->z, &h);

    secp256k1_fe_sqr(&h2, &h);
    secp256k1_fe_negate(&h2, &h2, 1);
    secp256k1_fe_mul(&h3, &h2, &h);
    secp256k1_fe_mul(&t, &u1, &h2);

    secp256k1_fe_sqr(&r->x, &i);
    secp256k1_fe_add(&r->x, &h3);
    secp256k1_fe_add(&r->x, &t);
    secp256k1_fe_add(&r->x, &t);

    secp256k1_fe_add(&t, &r->x);
    secp256k1_fe_mul(&r->y, &t, &i);
    secp256k1_fe_mul(&h3, &h3, &s1);
    secp256k1_fe_add(&r->y, &h3);

    SECP256K1_GEJ_VERIFY(r);
}